

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elim.cpp
# Opt level: O3

void __thiscall
CaDiCaL::Internal::try_to_eliminate_variable
          (Internal *this,Eliminator *eliminator,int pivot,bool *deleted_binary_clause)

{
  pointer ppCVar1;
  pointer ppCVar2;
  uint uVar3;
  bool bVar4;
  size_t sVar5;
  size_t sVar6;
  long lVar7;
  Clause **ppCVar8;
  pointer pvVar9;
  size_t sVar10;
  uint uVar11;
  pair<CaDiCaL::Clause_**,_long> pVar12;
  
  uVar11 = -pivot;
  uVar3 = pivot;
  if (pivot < 1) {
    uVar3 = uVar11;
  }
  if (((uint)(this->ftab).super__Vector_base<CaDiCaL::Flags,_std::allocator<CaDiCaL::Flags>_>.
             _M_impl.super__Vector_impl_data._M_start[uVar3] & 0x7000000) == 0x1000000) {
    sVar5 = flush_occs(this,pivot);
    sVar6 = flush_occs(this,uVar11);
    sVar10 = sVar6;
    if ((long)sVar5 < (long)sVar6) {
      sVar10 = sVar5;
    }
    if ((long)sVar6 < (long)sVar5) {
      pivot = uVar11;
      sVar6 = sVar5;
    }
    if ((sVar10 == 0) || ((long)sVar6 <= (long)(this->opts).elimocclim)) {
      uVar11 = uVar3 << 1 | (uint)pivot >> 0x1f;
      pvVar9 = (this->otab).
               super__Vector_base<std::vector<CaDiCaL::Clause_*,_std::allocator<CaDiCaL::Clause_*>_>,_std::allocator<std::vector<CaDiCaL::Clause_*,_std::allocator<CaDiCaL::Clause_*>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      ppCVar1 = pvVar9[uVar11].
                super__Vector_base<CaDiCaL::Clause_*,_std::allocator<CaDiCaL::Clause_*>_>._M_impl.
                super__Vector_impl_data._M_start;
      ppCVar2 = *(pointer *)
                 ((long)&pvVar9[uVar11].
                         super__Vector_base<CaDiCaL::Clause_*,_std::allocator<CaDiCaL::Clause_*>_>.
                         _M_impl.super__Vector_impl_data + 8);
      if (ppCVar1 != ppCVar2) {
        lVar7 = (long)ppCVar2 - (long)ppCVar1 >> 3;
        pVar12 = std::get_temporary_buffer<CaDiCaL::Clause*>((lVar7 - (lVar7 + 1 >> 0x3f)) + 1 >> 1)
        ;
        lVar7 = pVar12.second;
        ppCVar8 = pVar12.first;
        if (ppCVar8 == (Clause **)0x0) {
          lVar7 = 0;
          std::
          __inplace_stable_sort<__gnu_cxx::__normal_iterator<CaDiCaL::Clause**,std::vector<CaDiCaL::Clause*,std::allocator<CaDiCaL::Clause*>>>,__gnu_cxx::__ops::_Iter_comp_iter<CaDiCaL::clause_smaller_size>>
                    (ppCVar1,ppCVar2);
        }
        else {
          std::
          __stable_sort_adaptive<__gnu_cxx::__normal_iterator<CaDiCaL::Clause**,std::vector<CaDiCaL::Clause*,std::allocator<CaDiCaL::Clause*>>>,CaDiCaL::Clause**,long,__gnu_cxx::__ops::_Iter_comp_iter<CaDiCaL::clause_smaller_size>>
                    (ppCVar1,ppCVar2,ppCVar8,lVar7);
        }
        operator_delete(ppCVar8,lVar7 << 3);
        pvVar9 = (this->otab).
                 super__Vector_base<std::vector<CaDiCaL::Clause_*,_std::allocator<CaDiCaL::Clause_*>_>,_std::allocator<std::vector<CaDiCaL::Clause_*,_std::allocator<CaDiCaL::Clause_*>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      }
      uVar11 = (uint)-pivot >> 0x1f | uVar3 << 1;
      ppCVar1 = pvVar9[uVar11].
                super__Vector_base<CaDiCaL::Clause_*,_std::allocator<CaDiCaL::Clause_*>_>._M_impl.
                super__Vector_impl_data._M_start;
      ppCVar2 = *(pointer *)
                 ((long)&pvVar9[uVar11].
                         super__Vector_base<CaDiCaL::Clause_*,_std::allocator<CaDiCaL::Clause_*>_>.
                         _M_impl.super__Vector_impl_data + 8);
      if (ppCVar1 != ppCVar2) {
        lVar7 = (long)ppCVar2 - (long)ppCVar1 >> 3;
        pVar12 = std::get_temporary_buffer<CaDiCaL::Clause*>((lVar7 - (lVar7 + 1 >> 0x3f)) + 1 >> 1)
        ;
        lVar7 = pVar12.second;
        ppCVar8 = pVar12.first;
        if (ppCVar8 == (Clause **)0x0) {
          lVar7 = 0;
          std::
          __inplace_stable_sort<__gnu_cxx::__normal_iterator<CaDiCaL::Clause**,std::vector<CaDiCaL::Clause*,std::allocator<CaDiCaL::Clause*>>>,__gnu_cxx::__ops::_Iter_comp_iter<CaDiCaL::clause_smaller_size>>
                    (ppCVar1,ppCVar2);
        }
        else {
          std::
          __stable_sort_adaptive<__gnu_cxx::__normal_iterator<CaDiCaL::Clause**,std::vector<CaDiCaL::Clause*,std::allocator<CaDiCaL::Clause*>>>,CaDiCaL::Clause**,long,__gnu_cxx::__ops::_Iter_comp_iter<CaDiCaL::clause_smaller_size>>
                    (ppCVar1,ppCVar2,ppCVar8,lVar7);
        }
        operator_delete(ppCVar8,lVar7 << 3);
      }
      if (sVar10 != 0) {
        find_gate_clauses(this,eliminator,pivot);
      }
      if (((this->unsat == false) && (this->vals[pivot] == '\0')) &&
         (bVar4 = elim_resolvents_are_bounded(this,eliminator,pivot), bVar4)) {
        elim_add_resolvents(this,eliminator,pivot);
        if (this->unsat == false) {
          mark_eliminated_clauses_as_garbage(this,eliminator,pivot,deleted_binary_clause);
        }
        if (((uint)(this->ftab).super__Vector_base<CaDiCaL::Flags,_std::allocator<CaDiCaL::Flags>_>.
                   _M_impl.super__Vector_impl_data._M_start[uVar3] & 0x7000000) == 0x1000000) {
          mark_eliminated(this,pivot);
        }
      }
      unmark_gate_clauses(this,eliminator);
      elim_backward_clauses(this,eliminator);
      return;
    }
  }
  return;
}

Assistant:

void Internal::try_to_eliminate_variable (Eliminator &eliminator, int pivot,
                                          bool &deleted_binary_clause) {

  if (!active (pivot))
    return;
  assert (!frozen (pivot));

  // First flush garbage clauses.
  //
  int64_t pos = flush_occs (pivot);
  int64_t neg = flush_occs (-pivot);

  if (pos > neg) {
    pivot = -pivot;
    swap (pos, neg);
  }
  LOG ("pivot %d occurs positively %" PRId64
       " times and negatively %" PRId64 " times",
       pivot, pos, neg);
  assert (!eliminator.schedule.contains (abs (pivot)));
  assert (pos <= neg);

  if (pos && neg > opts.elimocclim) {
    LOG ("too many occurrences thus not eliminated %d", pivot);
    assert (!eliminator.schedule.contains (abs (pivot)));
    return;
  }

  LOG ("trying to eliminate %d", pivot);
  assert (!flags (pivot).eliminated ());

  // Sort occurrence lists, such that shorter clauses come first.
  Occs &ps = occs (pivot);
  stable_sort (ps.begin (), ps.end (), clause_smaller_size ());
  Occs &ns = occs (-pivot);
  stable_sort (ns.begin (), ns.end (), clause_smaller_size ());

  if (pos)
    find_gate_clauses (eliminator, pivot);

  if (!unsat && !val (pivot)) {
    if (elim_resolvents_are_bounded (eliminator, pivot)) {
      LOG ("number of resolvents on %d are bounded", pivot);
      elim_add_resolvents (eliminator, pivot);
      if (!unsat)
        mark_eliminated_clauses_as_garbage (eliminator, pivot,
                                            deleted_binary_clause);
      if (active (pivot))
        mark_eliminated (pivot);
    } else
      LOG ("too many resolvents on %d so not eliminated", pivot);
  }

  unmark_gate_clauses (eliminator);
  elim_backward_clauses (eliminator);
}